

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O2

bool ParseCommandLine(int argc_,char **argv_)

{
  PreferredData PVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  exception *peVar5;
  char *pcVar6;
  long lVar7;
  char **ppcVar8;
  allocator<char> local_d1;
  string str;
  string local_b0;
  allocator<char> local_90 [32];
  string local_70;
  string local_50;
  
  opterr = 1;
switchD_0016f338_caseD_45:
  iVar3 = getopt_long(argc_,argv_,short_options,long_options,(int *)0x0);
  iVar4 = optind;
  switch(iVar3) {
  case 0x44:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.datacopy = util::str_value<int>(&str);
    break;
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x6a:
  case 0x6c:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x77:
  case 0x79:
    goto switchD_0016f338_caseD_45;
  case 0x46:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.fill = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (0xff < opt.fill) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[21],char*&,char_const(&)[18]>
                (peVar5,(char (*) [21])"invalid fill value \'",&optarg,
                 (char (*) [18])"\', expected 0-255");
      goto LAB_001700a5;
    }
    goto switchD_0016f338_caseD_45;
  case 0x48:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.hardsectors = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (opt.hardsectors < 2) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],char*&,char_const(&)[2]>
                (peVar5,(char (*) [28])"invalid hard-sector count \'",&optarg,(char (*) [2])0x1aace7
                );
      goto LAB_001700a5;
    }
    goto switchD_0016f338_caseD_45;
  case 0x4c:
    std::__cxx11::string::assign((char *)&opt.label);
    goto switchD_0016f338_caseD_45;
  case 0x52:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.rescans = util::str_value<int>(&str);
    break;
  case 0x62:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.base = util::str_value<int>(&str);
    break;
  case 99:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    util::str_range(&str,(int *)&opt,&opt.range.cyl_end);
    std::__cxx11::string::~string((string *)&str);
    iVar4 = Range::cyls(&opt.range);
    if (iVar4 == 0) {
      opt.range.cyl_end = 1;
    }
    goto switchD_0016f338_caseD_45;
  case 100:
    opt.step = 2;
    goto switchD_0016f338_caseD_45;
  case 0x65:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,optarg,(allocator<char> *)&str);
    opt.encoding = encoding_from_string(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (opt.encoding == Unknown) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[19],char*&,char_const(&)[2]>
                (peVar5,(char (*) [19])"invalid encoding \'",&optarg,(char (*) [2])0x1aace7);
      goto LAB_001700a5;
    }
    goto switchD_0016f338_caseD_45;
  case 0x66:
    opt.force = opt.force + 1;
    goto switchD_0016f338_caseD_45;
  case 0x67:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.gap3 = util::str_value<int>(&str);
    break;
  case 0x68:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    iVar4 = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (2 < iVar4) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28],char*&,char_const(&)[15],int_const&>
                (peVar5,(char (*) [28])"invalid head count/select \'",&optarg,
                 (char (*) [15])"\', expected 0-",&MAX_DISK_HEADS);
      goto LAB_001700a5;
    }
    opt.range.head_begin = (int)(iVar4 == 1);
    opt.range.head_end = 2 - (uint)(iVar4 == 0);
    goto switchD_0016f338_caseD_45;
  case 0x69:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.interleave = util::str_value<int>(&str);
    break;
  case 0x6b:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.skew = util::str_value<int>(&str);
    break;
  case 0x6d:
    opt.minimal = 1;
    goto switchD_0016f338_caseD_45;
  case 0x6e:
    opt.noformat = 1;
    goto switchD_0016f338_caseD_45;
  case 0x72:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.retries = util::str_value<int>(&str);
    break;
  case 0x73:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.sectors = util::str_value<long>(&str);
    break;
  case 0x74:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,optarg,(allocator<char> *)&str);
    opt.datarate = datarate_from_string(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (opt.datarate == Unknown) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[20],char*&,char_const(&)[2]>
                (peVar5,(char (*) [20])"invalid data rate \'",&optarg,(char (*) [2])0x1aace7);
      goto LAB_001700a5;
    }
    goto switchD_0016f338_caseD_45;
  case 0x76:
    opt.verbose = opt.verbose + 1;
    goto switchD_0016f338_caseD_45;
  case 0x78:
    opt.hex = 1;
    goto switchD_0016f338_caseD_45;
  case 0x7a:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.size = util::str_value<int>(&str);
    break;
  default:
    goto code_r0x0016f36f;
  }
  goto LAB_0016fbe8;
LAB_0016fd51:
  if (lVar7 == 0xc) {
LAB_0016fdb0:
    if (opt.absoffsets != 0) {
      opt.offsets = 1;
      return true;
    }
    return true;
  }
  iVar3 = strcasecmp(pcVar6,*ppcVar8);
  if (iVar3 == 0) {
    if (opt.command != 0) {
LAB_001700f9:
      iVar4 = Usage();
      std::__cxx11::string::~string((string *)&str);
      _Unwind_Resume(iVar4);
    }
    opt.command = (int)lVar7;
    optind = iVar4 + 1;
    goto LAB_0016fdb0;
  }
  lVar7 = lVar7 + 1;
  ppcVar8 = ppcVar8 + 1;
  goto LAB_0016fd51;
switchD_0016f37d_caseD_102:
  LongVersion();
  return false;
code_r0x0016f36f:
  switch(iVar3) {
  case 0x100:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.rpm = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if ((opt.rpm == 300) || (opt.rpm == 0x168)) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[14],char*&,char_const(&)[23]>
              (peVar5,(char (*) [14])"invalid rpm \'",&optarg,
               (char (*) [23])"\', expected 300 or 360");
    break;
  case 0x101:
    pcVar6 = optarg;
    if (optarg == (char *)0x0) {
      pcVar6 = "samdisk.log";
    }
    std::ofstream::open((char *)&util::log,(_Ios_Openmode)pcVar6);
    if (((&DAT_001e1110)[*(long *)(util::log + -0x18)] & 1) == 0) {
      DAT_001e12f8 = &util::log;
      goto switchD_0016f338_caseD_45;
    }
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[36]>
              (peVar5,(char (*) [36])"failed to open log file for writing");
    break;
  case 0x102:
    goto switchD_0016f37d_caseD_102;
  case 0x103:
  case 0x104:
    goto switchD_0016f338_caseD_45;
  case 0x105:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.gapmask = util::str_value<int>(&str);
    goto LAB_0016fbe8;
  case 0x106:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.maxcopies = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (opt.maxcopies != 0) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[26],char*&,char_const(&)[17]>
              (peVar5,(char (*) [26])"invalid data copy count \'",&optarg,
               (char (*) [17])"\', expected >= 1");
    break;
  case 0x107:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.maxsplice = util::str_value<int>(&str);
    goto LAB_0016fbe8;
  case 0x108:
    if (optarg == (char *)0x0) {
      opt.check8k = 1;
      goto switchD_0016f338_caseD_45;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.check8k = util::str_value<int>(&str);
    goto LAB_0016fbe8;
  case 0x109:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    util::str_range(&str,&opt.bytes_begin,&opt.bytes_end);
    goto LAB_0016fbe8;
  case 0x10a:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.hdf = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (0xfffffffd < opt.hdf - 0xcU) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[22],char*&,char_const(&)[21]>
              (peVar5,(char (*) [22])"invalid HDF version \'",&optarg,
               (char (*) [21])"\', expected 10 or 11");
    break;
  case 0x10b:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,optarg,local_90);
    util::lowercase(&str,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"cylinders",&local_d1);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
    _Var2 = std::operator==(&str,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_90);
    iVar4 = 1;
    PVar1 = opt.prefer;
    if (!_Var2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"heads",&local_d1);
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
      _Var2 = std::operator==(&str,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_90);
      iVar4 = 0;
      PVar1 = opt.prefer;
      if (!_Var2) {
        peVar5 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[21],char*&,char_const(&)[35]>
                  (peVar5,(char (*) [21])"invalid order type \'",&optarg,
                   (char (*) [35])"\', expected \'cylinders\' or \'heads\'");
        __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    goto LAB_0016fbaf;
  case 0x10c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.scale = util::str_value<int>(&str);
LAB_0016fbe8:
    std::__cxx11::string::~string((string *)&str);
    goto switchD_0016f338_caseD_45;
  case 0x10d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.plladjust = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (0xffffffcd < opt.plladjust - 0x33U) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    str._M_dataplus._M_p._0_4_ = 0x32;
    util::exception::exception<char_const(&)[25],char*&,char_const(&)[15],int>
              (peVar5,(char (*) [25])"invalid pll adjustment \'",&optarg,
               (char (*) [15])"\', expected 1-",(int *)&str);
    break;
  case 0x10e:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.pllphase = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (0xffffffa5 < opt.pllphase - 0x5bU) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    str._M_dataplus._M_p._0_4_ = 0x5a;
    util::exception::exception<char_const(&)[20],char*&,char_const(&)[15],int>
              (peVar5,(char (*) [20])"invalid pll phase \'",&optarg,(char (*) [15])"\', expected 1-"
               ,(int *)&str);
    break;
  case 0x10f:
    opt.encoding = Ace;
    goto switchD_0016f338_caseD_45;
  case 0x110:
    opt.encoding = MX;
    goto switchD_0016f338_caseD_45;
  case 0x111:
    opt.encoding = Agat;
    goto switchD_0016f338_caseD_45;
  case 0x112:
    opt.encoding = MFM;
    goto switchD_0016f338_caseD_45;
  case 0x113:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.steprate = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (opt.steprate < 0x10) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[20],char*&,char_const(&)[17]>
              (peVar5,(char (*) [20])"invalid step rate \'",&optarg,
               (char (*) [17])"\', expected 0-15");
    break;
  case 0x114:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,optarg,local_90);
    util::lowercase(&str,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"track",&local_d1);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
    _Var2 = std::operator==(&str,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_90);
    iVar4 = opt.cylsfirst;
    PVar1 = Track;
    if (!_Var2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"bitstream",&local_d1);
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
      _Var2 = std::operator==(&str,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_90);
      iVar4 = opt.cylsfirst;
      PVar1 = Bitstream;
      if (!_Var2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"flux",&local_d1);
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
        _Var2 = std::operator==(&str,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)local_90);
        iVar4 = opt.cylsfirst;
        PVar1 = Flux;
        if (!_Var2) {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[20],char*&,char_const(&)[33]>
                    (peVar5,(char (*) [20])"invalid data type \'",&optarg,
                     (char (*) [33])"\', expected track/bitstream/flux");
          __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
LAB_0016fbaf:
    opt.prefer = PVar1;
    opt.cylsfirst = iVar4;
    std::__cxx11::string::~string((string *)&str);
    goto switchD_0016f338_caseD_45;
  case 0x115:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,optarg,(allocator<char> *)&local_b0);
    opt.debug = util::str_value<int>(&str);
    std::__cxx11::string::~string((string *)&str);
    if (-1 < opt.debug) goto switchD_0016f338_caseD_45;
    peVar5 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[35]>
              (peVar5,(char (*) [35])"invalid debug level, expected >= 0");
    break;
  default:
    if (iVar3 == 0x30) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,optarg,(allocator<char> *)&local_b0);
      opt.head0 = util::str_value<int>(&str);
      std::__cxx11::string::~string((string *)&str);
      if (opt.head0 < 2) goto switchD_0016f338_caseD_45;
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[22],char*&,char_const(&)[19]>
                (peVar5,(char (*) [22])"invalid head0 value \'",&optarg,
                 (char (*) [19])"\', expected 0 or 1");
    }
    else {
      if (iVar3 != 0x31) {
        if (iVar3 == -1) {
          if (optind < argc_) {
            pcVar6 = argv_[optind];
            ppcVar8 = aszCommands;
            lVar7 = 0;
            goto LAB_0016fd51;
          }
          if (opt.verbose == 0) goto LAB_001700f9;
          goto switchD_0016f37d_caseD_102;
        }
        if ((iVar3 == 0x3a) || (iVar3 == 0x3f)) {
          str._M_dataplus._M_p._0_1_ = 10;
          util::operator<<((LogHelper *)&util::cout,(char *)&str);
          return false;
        }
        goto switchD_0016f338_caseD_45;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,optarg,(allocator<char> *)&local_b0);
      opt.head1 = util::str_value<int>(&str);
      std::__cxx11::string::~string((string *)&str);
      if (opt.head1 < 2) goto switchD_0016f338_caseD_45;
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[22],char*&,char_const(&)[19]>
                (peVar5,(char (*) [22])"invalid head1 value \'",&optarg,
                 (char (*) [19])"\', expected 0 or 1");
    }
  }
LAB_001700a5:
  __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ParseCommandLine(int argc_, char* argv_[])
{
    int arg;
    opterr = 1;

    while ((arg = getopt_long(argc_, argv_, short_options, long_options, nullptr)) != -1)
    {
        switch (arg)
        {
        case 'c':
            util::str_range(optarg, opt.range.cyl_begin, opt.range.cyl_end);

            // -c0 is shorthand for -c0-0
            if (opt.range.cyls() == 0)
                opt.range.cyl_end = 1;
            break;

        case 'h':
        {
            auto heads = util::str_value<int>(optarg);
            if (heads > MAX_DISK_HEADS)
                throw util::exception("invalid head count/select '", optarg, "', expected 0-", MAX_DISK_HEADS);

            opt.range.head_begin = (heads == 1) ? 1 : 0;
            opt.range.head_end = (heads == 0) ? 1 : 2;
            break;
        }

        case 's':
            opt.sectors = util::str_value<long>(optarg);
            break;

        case 'H':
            opt.hardsectors = util::str_value<int>(optarg);
            if (opt.hardsectors <= 1)
                throw util::exception("invalid hard-sector count '", optarg, "'");
            break;

        case 'r':
            opt.retries = util::str_value<int>(optarg);
            break;

        case 'R':
            opt.rescans = util::str_value<int>(optarg);
            break;

        case 'n':   opt.noformat = 1; break;
        case 'm':   opt.minimal = 1; break;

        case 'b':   opt.base = util::str_value<int>(optarg); break;
        case 'z':   opt.size = util::str_value<int>(optarg); break;
        case 'g':   opt.gap3 = util::str_value<int>(optarg); break;
        case 'i':   opt.interleave = util::str_value<int>(optarg); break;
        case 'k':   opt.skew = util::str_value<int>(optarg); break;
        case 'D':   opt.datacopy = util::str_value<int>(optarg); break;

        case 'F':
            opt.fill = util::str_value<int>(optarg);
            if (opt.fill > 255)
                throw util::exception("invalid fill value '", optarg, "', expected 0-255");
            break;
        case '0':
            opt.head0 = util::str_value<int>(optarg);
            if (opt.head0 > 1)
                throw util::exception("invalid head0 value '", optarg, "', expected 0 or 1");
            break;
        case '1':
            opt.head1 = util::str_value<int>(optarg);
            if (opt.head1 > 1)
                throw util::exception("invalid head1 value '", optarg, "', expected 0 or 1");
            break;

        case 't':
            opt.datarate = datarate_from_string(optarg);
            if (opt.datarate == DataRate::Unknown)
                throw util::exception("invalid data rate '", optarg, "'");
            break;

        case 'e':
            opt.encoding = encoding_from_string(optarg);
            if (opt.encoding == Encoding::Unknown)
                throw util::exception("invalid encoding '", optarg, "'");
            break;

        case 'd':   opt.step = 2; break;
        case 'f':   ++opt.force; break;
        case 'v':   ++opt.verbose; break;
        case 'x':   opt.hex = 1; break;

        case 'L':   opt.label = optarg; break;

        case OPT_LOG:
            util::log.open(optarg ? optarg : "samdisk.log");
            if (util::log.bad())
                throw util::exception("failed to open log file for writing");
            util::cout.file = &util::log;
            break;

        case OPT_ORDER:
        {
            auto str = util::lowercase(optarg);
            if (str == std::string("cylinders").substr(0, str.length()))
                opt.cylsfirst = 1;
            else if (str == std::string("heads").substr(0, str.length()))
                opt.cylsfirst = 0;
            else
                throw util::exception("invalid order type '", optarg, "', expected 'cylinders' or 'heads'");
            break;
        }

        case OPT_PREFER:
        {
            auto str = util::lowercase(optarg);
            if (str == std::string("track").substr(0, str.length()))
                opt.prefer = PreferredData::Track;
            else if (str == std::string("bitstream").substr(0, str.length()))
                opt.prefer = PreferredData::Bitstream;
            else if (str == std::string("flux").substr(0, str.length()))
                opt.prefer = PreferredData::Flux;
            else
                throw util::exception("invalid data type '", optarg, "', expected track/bitstream/flux");
            break;
        }

        case OPT_ACE:   opt.encoding = Encoding::Ace;   break;
        case OPT_MX:    opt.encoding = Encoding::MX;    break;
        case OPT_AGAT:  opt.encoding = Encoding::Agat;  break;
        case OPT_NOFM:  opt.encoding = Encoding::MFM;   break;

        case OPT_GAPMASK:
            opt.gapmask = util::str_value<int>(optarg);
            break;
        case OPT_MAXCOPIES:
            opt.maxcopies = util::str_value<int>(optarg);
            if (!opt.maxcopies)
                throw util::exception("invalid data copy count '", optarg, "', expected >= 1");
            break;
        case OPT_MAXSPLICE:
            opt.maxsplice = util::str_value<int>(optarg);
            break;
        case OPT_CHECK8K:
            opt.check8k = !optarg ? 1 : util::str_value<int>(optarg);
            break;
        case OPT_RPM:
            opt.rpm = util::str_value<int>(optarg);
            if (opt.rpm != 300 && opt.rpm != 360)
                throw util::exception("invalid rpm '", optarg, "', expected 300 or 360");
            break;
        case OPT_HDF:
            opt.hdf = util::str_value<int>(optarg);
            if (opt.hdf != 10 && opt.hdf != 11)
                throw util::exception("invalid HDF version '", optarg, "', expected 10 or 11");
            break;
        case OPT_SCALE:
            opt.scale = util::str_value<int>(optarg);
            break;
        case OPT_PLLADJUST:
            opt.plladjust = util::str_value<int>(optarg);
            if (opt.plladjust <= 0 || opt.plladjust > MAX_PLL_ADJUST)
                throw util::exception("invalid pll adjustment '", optarg, "', expected 1-", MAX_PLL_ADJUST);
            break;
        case OPT_PLLPHASE:
            opt.pllphase = util::str_value<int>(optarg);
            if (opt.pllphase <= 0 || opt.pllphase > MAX_PLL_PHASE)
                throw util::exception("invalid pll phase '", optarg, "', expected 1-", MAX_PLL_PHASE);
            break;
        case OPT_STEPRATE:
            opt.steprate = util::str_value<int>(optarg);
            if (opt.steprate > 15)
                throw util::exception("invalid step rate '", optarg, "', expected 0-15");
            break;

        case OPT_BYTES:
            util::str_range(optarg, opt.bytes_begin, opt.bytes_end);
            break;

        case OPT_DEBUG:
            opt.debug = util::str_value<int>(optarg);
            if (opt.debug < 0)
                throw util::exception("invalid debug level, expected >= 0");
            break;

        case OPT_VERSION:
            LongVersion();
            return false;

        case ':':
        case '?':   // error
            util::cout << '\n';
            return false;

            // long option return
        case 0:
            break;
#ifdef _DEBUG
        default:
            return false;
#endif
        }
    }

    // Fail if there are no non-option arguments
    if (optind >= argc_)
    {
        if (!opt.verbose)
            Usage();

        // Allow -v to show the --version details
        LongVersion();
        return false;
    }

    // The command is the first argument
    char* pszCommand = argv_[optind];

    // Match against known commands
    for (int i = 0; i < cmdEnd; ++i)
    {
        if (!strcasecmp(pszCommand, aszCommands[i]))
        {
            // Fail if a command has already been set
            if (opt.command)
                Usage();

            // Set the command and advance to the next argument position
            opt.command = i;
            ++optind;
            break;
        }
    }

    if (opt.absoffsets) opt.offsets = 1;

    return true;
}